

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x509_cmp.cc
# Opt level: O0

int X509_cmp(X509 *a,X509 *b)

{
  int iVar1;
  X509 *b_local;
  X509 *a_local;
  
  x509v3_cache_extensions((X509 *)a);
  x509v3_cache_extensions((X509 *)b);
  iVar1 = OPENSSL_memcmp(&a->skid,&b->skid,0x20);
  return iVar1;
}

Assistant:

int X509_cmp(const X509 *a, const X509 *b) {
  // Fill in the |cert_hash| fields.
  //
  // TODO(davidben): This may fail, in which case the the hash will be all
  // zeros. This produces a consistent comparison (failures are sticky), but
  // not a good one. OpenSSL now returns -2, but this is not a consistent
  // comparison and may cause misbehaving sorts by transitivity. For now, we
  // retain the old OpenSSL behavior, which was to ignore the error. See
  // https://crbug.com/boringssl/355.
  x509v3_cache_extensions((X509 *)a);
  x509v3_cache_extensions((X509 *)b);

  return OPENSSL_memcmp(a->cert_hash, b->cert_hash, SHA256_DIGEST_LENGTH);
}